

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

bool __thiscall
fmt::v8::detail::write_int_localized<fmt::v8::appender,unsigned__int128,char>
          (detail *this,appender *out,unsigned___int128 value,uint prefix,
          basic_format_specs<char> *specs,locale_ref loc)

{
  char cVar1;
  undefined1 n [16];
  undefined1 value_00 [16];
  long lVar2;
  detail dVar3;
  uint uVar4;
  appender aVar5;
  int iVar6;
  detail *pdVar7;
  detail *pdVar8;
  size_type sVar9;
  char *pcVar10;
  uint uVar11;
  locale_ref in_R9;
  uint uVar12;
  ulong uVar13;
  thousands_sep_result<char> ts;
  char digits [40];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  undefined8 in_stack_fffffffffffffd38;
  undefined8 in_stack_fffffffffffffd40;
  undefined1 local_2b0 [40];
  detail local_288 [48];
  anon_class_16_2_3f014a30 local_258;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_248;
  ulong count;
  
  thousands_sep<char>((thousands_sep_result<char> *)local_2b0,in_R9);
  dVar3 = local_2b0[0x20];
  if (local_2b0[0x20] != (detail)0x0) {
    n._8_8_ = in_stack_fffffffffffffd40;
    n._0_8_ = in_stack_fffffffffffffd38;
    uVar4 = count_digits_fallback<unsigned__int128>((detail *)out,(unsigned___int128)n);
    uVar13 = (ulong)uVar4;
    iVar6 = (int)local_2b0._8_8_ + uVar4;
    uVar12 = uVar4;
    for (sVar9 = 0; local_2b0._8_8_ != sVar9; sVar9 = sVar9 + 1) {
      cVar1 = *(char *)(local_2b0._0_8_ + sVar9);
      uVar11 = uVar12 - (int)cVar1;
      if ((uVar11 == 0 || (int)uVar12 < (int)cVar1) || ((byte)(cVar1 + 0x81U) < 0x82)) {
        iVar6 = uVar4 + (int)sVar9;
        if (local_2b0._8_8_ != sVar9) goto LAB_00116569;
        break;
      }
      uVar12 = uVar11;
    }
    iVar6 = (int)(uVar12 - 1) / (int)*(char *)(local_2b0._0_8_ + (local_2b0._8_8_ - 1)) + iVar6;
LAB_00116569:
    value_00._8_8_ = loc.locale_;
    value_00._0_8_ = in_stack_fffffffffffffd38;
    format_decimal<char,unsigned__int128>(local_288,(char *)out,(unsigned___int128)value_00,prefix);
    local_248.super_buffer<char>.ptr_ = local_248.store_;
    local_248.super_buffer<char>.size_ = 0;
    local_248.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_0015c4c0;
    local_248.super_buffer<char>.capacity_ = 500;
    uVar12 = (iVar6 + 1) - (uint)((int)specs == 0);
    count = (ulong)uVar12;
    buffer<char>::try_resize(&local_248.super_buffer<char>,count);
    iVar6 = 0;
    pdVar8 = (detail *)(local_248.super_buffer<char>.ptr_ + (long)(int)uVar12 + -1);
    pcVar10 = (char *)local_2b0._0_8_;
    while (pdVar7 = pdVar8, 1 < (int)uVar13) {
      lVar2 = uVar13 + 0x27;
      uVar13 = uVar13 - 1;
      *pdVar7 = *(detail *)(local_2b0 + lVar2);
      pdVar8 = pdVar7 + -1;
      cVar1 = *pcVar10;
      if ('\0' < cVar1) {
        iVar6 = iVar6 + 1;
        if ((cVar1 != '\x7f') && (iVar6 % (int)cVar1 == 0)) {
          if (pcVar10 + 1 != (char *)(local_2b0._0_8_ + local_2b0._8_8_)) {
            iVar6 = 0;
            pcVar10 = pcVar10 + 1;
          }
          *pdVar8 = local_2b0[0x20];
          pdVar8 = pdVar7 + -2;
        }
      }
    }
    *pdVar7 = local_288[0];
    if ((int)specs != 0) {
      pdVar7[-1] = SUB81(specs,0);
    }
    local_258.data = local_248.super_buffer<char>.ptr_;
    local_258.size = uVar12;
    aVar5 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int_localized<fmt::v8::appender,unsigned__int128,char>(fmt::v8::appender&,unsigned__int128,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_1_>
                      ((back_insert_iterator<fmt::v8::detail::buffer<char>_>)
                       *(back_insert_iterator<fmt::v8::detail::buffer<char>_> *)this,
                       (basic_format_specs<char> *)loc.locale_,count,count,&local_258);
    *(back_insert_iterator<fmt::v8::detail::buffer<char>_> *)this =
         aVar5.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::deallocate(&local_248);
  }
  std::__cxx11::string::~string((string *)local_2b0);
  return dVar3 != (detail)0x0;
}

Assistant:

auto write_int_localized(OutputIt& out, UInt value, unsigned prefix,
                         const basic_format_specs<Char>& specs, locale_ref loc)
    -> bool {
  static_assert(std::is_same<uint64_or_128_t<UInt>, UInt>::value, "");
  const auto sep_size = 1;
  auto ts = thousands_sep<Char>(loc);
  if (!ts.thousands_sep) return false;
  int num_digits = count_digits(value);
  int size = num_digits, n = num_digits;
  const std::string& groups = ts.grouping;
  std::string::const_iterator group = groups.cbegin();
  while (group != groups.cend() && n > *group && *group > 0 &&
         *group != max_value<char>()) {
    size += sep_size;
    n -= *group;
    ++group;
  }
  if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
  char digits[40];
  format_decimal(digits, value, num_digits);
  basic_memory_buffer<Char> buffer;
  if (prefix != 0) ++size;
  const auto usize = to_unsigned(size);
  buffer.resize(usize);
  basic_string_view<Char> s(&ts.thousands_sep, sep_size);
  // Index of a decimal digit with the least significant digit having index 0.
  int digit_index = 0;
  group = groups.cbegin();
  auto p = buffer.data() + size - 1;
  for (int i = num_digits - 1; i > 0; --i) {
    *p-- = static_cast<Char>(digits[i]);
    if (*group <= 0 || ++digit_index % *group != 0 ||
        *group == max_value<char>())
      continue;
    if (group + 1 != groups.cend()) {
      digit_index = 0;
      ++group;
    }
    std::uninitialized_copy(s.data(), s.data() + s.size(),
                            make_checked(p, s.size()));
    p -= s.size();
  }
  *p-- = static_cast<Char>(*digits);
  if (prefix != 0) *p = static_cast<Char>(prefix);
  auto data = buffer.data();
  out = write_padded<align::right>(
      out, specs, usize, usize, [=](reserve_iterator<OutputIt> it) {
        return copy_str<Char>(data, data + size, it);
      });
  return true;
}